

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

int SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  SUNMatrix_ID SVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  iVar5 = SMCompatible_Band(A,B);
  if (iVar5 == 0) {
    return -0x2bd;
  }
  pvVar8 = A->content;
  iVar5 = *(int *)((long)pvVar8 + 0xc);
  pvVar7 = B->content;
  iVar1 = *(int *)((long)pvVar7 + 0xc);
  if (iVar1 < iVar5) {
    iVar12 = *(int *)((long)pvVar7 + 0x10);
    iVar10 = *(int *)((long)pvVar8 + 0x10);
  }
  else {
    iVar10 = *(int *)((long)pvVar8 + 0x10);
    iVar12 = *(int *)((long)pvVar7 + 0x10);
    if (iVar10 <= iVar12) goto LAB_003f3e61;
  }
  if (iVar10 < iVar12) {
    iVar10 = iVar12;
  }
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  iVar1 = *(int *)((long)pvVar8 + 0x14);
  if (*(int *)((long)pvVar8 + 0x14) < *(int *)((long)pvVar7 + 0x14)) {
    iVar1 = *(int *)((long)pvVar7 + 0x14);
  }
  iVar12 = iVar10 + 1 + iVar1;
  *(int *)((long)pvVar7 + 0xc) = iVar5;
  *(int *)((long)pvVar7 + 0x10) = iVar10;
  *(int *)((long)pvVar7 + 0x14) = iVar1;
  *(int *)((long)pvVar7 + 8) = iVar12;
  lVar11 = (long)*(int *)((long)pvVar7 + 4) * (long)iVar12;
  *(int *)((long)pvVar7 + 0x20) = (int)lVar11;
  pvVar7 = realloc(*(void **)((long)pvVar7 + 0x18),lVar11 * 8);
  pvVar8 = B->content;
  *(void **)((long)pvVar8 + 0x18) = pvVar7;
  if (0 < *(int *)((long)pvVar8 + 4)) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      *(long *)(*(long *)((long)pvVar8 + 0x28) + lVar9 * 8) =
           *(long *)((long)pvVar8 + 0x18) + lVar11;
      lVar9 = lVar9 + 1;
      pvVar8 = B->content;
      lVar11 = lVar11 + (long)iVar12 * 8;
    } while (lVar9 < *(int *)((long)pvVar8 + 4));
  }
LAB_003f3e61:
  SVar6 = SUNMatGetID(B);
  iVar5 = -0x2bf;
  if (SVar6 == SUNMATRIX_BAND) {
    pvVar8 = B->content;
    if (0 < (long)*(int *)((long)pvVar8 + 0x20)) {
      memset(*(void **)((long)pvVar8 + 0x18),0,(long)*(int *)((long)pvVar8 + 0x20) << 3);
    }
    iVar5 = *(int *)((long)pvVar8 + 4);
    if (0 < (long)iVar5) {
      lVar11 = *(long *)((long)pvVar8 + 0x28);
      iVar1 = *(int *)((long)pvVar8 + 0x14);
      pvVar8 = A->content;
      lVar9 = *(long *)((long)pvVar8 + 0x28);
      iVar12 = *(int *)((long)pvVar8 + 0x14);
      iVar10 = *(int *)((long)pvVar8 + 0xc);
      iVar2 = *(int *)((long)pvVar8 + 0x10);
      lVar13 = 0;
      do {
        if (SBORROW4(iVar2,-iVar10) == iVar2 + iVar10 < 0) {
          lVar3 = *(long *)(lVar9 + lVar13 * 8);
          lVar4 = *(long *)(lVar11 + lVar13 * 8);
          lVar14 = 0;
          do {
            *(undefined8 *)(lVar4 + (long)iVar1 * 8 + (long)iVar10 * -8 + lVar14 * 8) =
                 *(undefined8 *)(lVar3 + (long)iVar12 * 8 + (long)iVar10 * -8 + lVar14 * 8);
            lVar14 = lVar14 + 1;
          } while (iVar2 + iVar10 + 1 != (int)lVar14);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar5);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j, colSize, ml, mu, smu;
  realtype *A_colj, *B_colj;

  /* Verify that A and B have compatible dimensions */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Grow B if A's bandwidth is larger */
  if ( (SM_UBAND_B(A) > SM_UBAND_B(B)) ||
       (SM_LBAND_B(A) > SM_LBAND_B(B)) ) {
    ml  = SUNMAX(SM_LBAND_B(B),SM_LBAND_B(A));
    mu  = SUNMAX(SM_UBAND_B(B),SM_UBAND_B(A));
    smu = SUNMAX(SM_SUBAND_B(B),SM_SUBAND_B(A));
    colSize = smu + ml + 1;
    SM_CONTENT_B(B)->mu = mu;
    SM_CONTENT_B(B)->ml = ml;
    SM_CONTENT_B(B)->s_mu = smu;
    SM_CONTENT_B(B)->ldim = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data = (realtype *)
      realloc(SM_CONTENT_B(B)->data, SM_COLUMNS_B(B) * colSize*sizeof(realtype));
    for (j=0; j<SM_COLUMNS_B(B); j++)
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
  }

  /* Perform operation */
  if (SUNMatZero_Band(B) != SUNMAT_SUCCESS)
    return SUNMAT_OPERATION_FAIL;
  for (j=0; j<SM_COLUMNS_B(B); j++) {
    B_colj = SM_COLUMN_B(B,j);
    A_colj = SM_COLUMN_B(A,j);
    for (i=-SM_UBAND_B(A); i<=SM_LBAND_B(A); i++)
      B_colj[i] = A_colj[i];
  }
  return SUNMAT_SUCCESS;
}